

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

bool deqp::gles31::Functional::shaderContainsIOBlocks(Shader *shader)

{
  pointer pIVar1;
  int iVar2;
  ulong uVar3;
  Storage *pSVar4;
  ulong uVar5;
  
  pIVar1 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(shader->m_defaultBlock).interfaceBlocks.
                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x90;
  uVar5 = 0;
  iVar2 = (int)uVar3;
  uVar3 = uVar3 & 0xffffffff;
  if (iVar2 < 1) {
    uVar3 = uVar5;
  }
  pSVar4 = &pIVar1->storage;
  while ((uVar3 != uVar5 && ((STORAGE_PATCH_OUT < *pSVar4 || ((99U >> (*pSVar4 & 0x1f) & 1) == 0))))
        ) {
    uVar5 = uVar5 + 1;
    pSVar4 = pSVar4 + 0x24;
  }
  return (long)uVar5 < (long)iVar2;
}

Assistant:

bool shaderContainsIOBlocks (const ProgramInterfaceDefinition::Shader* shader)
{
	for (int ndx = 0; ndx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++ndx)
	{
		const glu::Storage storage = shader->getDefaultBlock().interfaceBlocks[ndx].storage;
		if (storage == glu::STORAGE_IN			||
			storage == glu::STORAGE_OUT			||
			storage == glu::STORAGE_PATCH_IN	||
			storage == glu::STORAGE_PATCH_OUT)
		{
			return true;
		}
	}
	return false;
}